

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

Box2i __thiscall
Imf_3_2::DeepTiledOutputFile::dataWindowForLevel(DeepTiledOutputFile *this,int lx,int ly)

{
  long lVar1;
  int in_ECX;
  undefined4 in_register_00000034;
  Box2i BVar2;
  stringstream _iex_replace_s;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,lx) + 8);
  BVar2 = Imf_3_2::dataWindowForLevel
                    ((Imf_3_2 *)this,(TileDescription *)(lVar1 + 0x40),*(int *)(lVar1 + 0xc4),
                     *(int *)(lVar1 + 200),*(int *)(lVar1 + 0xcc),*(int *)(lVar1 + 0xd0),ly,in_ECX);
  BVar2.min = (Vec2<int>)this;
  return BVar2;
}

Assistant:

Box2i
DeepTiledOutputFile::dataWindowForLevel (int lx, int ly) const
{
    try
    {
        return OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForLevel (
            _data->tileDesc,
            _data->minX,
            _data->maxX,
            _data->minY,
            _data->maxY,
            lx,
            ly);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error calling dataWindowForLevel() on image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}